

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldDescriptorProto::SharedCtor(FieldDescriptorProto *this)

{
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  this->name_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->number_ = 0;
  this->label_ = 1;
  this->type_ = 1;
  this->type_name_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->extendee_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->default_value_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->options_ = (FieldOptions *)0x0;
  return;
}

Assistant:

void FieldDescriptorProto::SharedCtor() {
  _cached_size_ = 0;
  name_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  number_ = 0;
  label_ = 1;
  type_ = 1;
  type_name_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  extendee_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  default_value_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  options_ = NULL;
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
}